

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O0

UBool equal_int32(int32_t *s,int32_t *t,int32_t length)

{
  bool bVar1;
  int local_1c;
  int32_t *piStack_18;
  int32_t length_local;
  int32_t *t_local;
  int32_t *s_local;
  
  local_1c = length;
  piStack_18 = t;
  t_local = s;
  while( true ) {
    bVar1 = false;
    if (0 < local_1c) {
      bVar1 = *t_local == *piStack_18;
    }
    if (!bVar1) break;
    t_local = t_local + 1;
    piStack_18 = piStack_18 + 1;
    local_1c = local_1c + -1;
  }
  return local_1c == 0;
}

Assistant:

static inline UBool
equal_int32(const int32_t *s, const int32_t *t, int32_t length) {
    while(length>0 && *s==*t) {
        ++s;
        ++t;
        --length;
    }
    return (UBool)(length==0);
}